

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceSpot::~IfcLightSourceSpot
          (IfcLightSourceSpot *this,void **vtt)

{
  void **vtt_local;
  IfcLightSourceSpot *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourceSpot,_4UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourceSpot,_4UL> *)
             &(this->super_IfcLightSourcePositional).field_0xb8,vtt + 0x17);
  IfcLightSourcePositional::~IfcLightSourcePositional(&this->super_IfcLightSourcePositional,vtt + 1)
  ;
  return;
}

Assistant:

IfcLightSourceSpot() : Object("IfcLightSourceSpot") {}